

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessage<duckdb::SQLIdentifier,duckdb::SQLString>
          (string *__return_storage_ptr__,Exception *this,string *msg,SQLIdentifier *params,
          SQLString *params_1)

{
  SQLString *in_R9;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  string local_78;
  SQLIdentifier local_58;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_38;
  
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  ::std::__cxx11::string::string((string *)&local_38,(string *)msg);
  ::std::__cxx11::string::string((string *)&local_58,(string *)params);
  ConstructMessageRecursive<duckdb::SQLIdentifier,duckdb::SQLString>
            (__return_storage_ptr__,this,&local_78,&local_38,&local_58,in_R9);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &local_78);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}